

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>
               (long array,uint size)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (1 < (int)size) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar7 = uVar5 & 0xffffffff;
      uVar6 = uVar4;
      do {
        uVar3 = uVar6 & 0xffffffff;
        if (*(int *)(array + (long)(int)uVar7 * 4) <= *(int *)(array + uVar6 * 4)) {
          uVar3 = uVar7;
        }
        uVar7 = uVar3;
        uVar6 = uVar6 + 1;
      } while (size != uVar6);
      uVar2 = *(undefined4 *)(array + uVar5 * 4);
      *(undefined4 *)(array + uVar5 * 4) = *(undefined4 *)(array + (long)(int)uVar7 * 4);
      *(undefined4 *)(array + (long)(int)uVar7 * 4) = uVar2;
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}